

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::AlreadyConnectedToAddress(CConnman *this,CAddress *addr)

{
  CNode *pCVar1;
  CConnman *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  CNetAddr *in_stack_ffffffffffffff68;
  bool local_89;
  CConnman *this_00;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CNetAddr *in_stack_ffffffffffffff98;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CConnman *)&stack0xffffffffffffffd8;
  CNetAddr::CNetAddr(in_stack_ffffffffffffff68,
                     (CNetAddr *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
  pCVar1 = FindNode(in_RSI,in_stack_ffffffffffffff98);
  local_89 = true;
  if (pCVar1 == (CNode *)0x0) {
    CService::ToStringAddrPort_abi_cxx11_
              ((CService *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff90 = 0x1000000;
    pCVar1 = FindNode(this_00,in_RDI);
    local_89 = pCVar1 != (CNode *)0x0;
  }
  if ((in_stack_ffffffffffffff90 & 0x1000000) != 0) {
    std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  }
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffff58);
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) != (__pthread_internal_list *)local_8) {
    __stack_chk_fail();
  }
  return local_89;
}

Assistant:

bool CConnman::AlreadyConnectedToAddress(const CAddress& addr)
{
    return FindNode(static_cast<CNetAddr>(addr)) || FindNode(addr.ToStringAddrPort());
}